

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall pbrt::ParameterDictionary::FreeParameters(ParameterDictionary *this)

{
  reference ppPVar1;
  long in_RDI;
  int i;
  size_type in_stack_ffffffffffffffd8;
  ParsedParameter *in_stack_ffffffffffffffe0;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x68); local_c = local_c + 1) {
    ppPVar1 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              ::operator[]((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                            *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = *ppPVar1;
    if (in_stack_ffffffffffffffe0 != (ParsedParameter *)0x0) {
      ParsedParameter::~ParsedParameter(in_stack_ffffffffffffffe0);
      operator_delete(in_stack_ffffffffffffffe0,0xf0);
    }
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::clear((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
           *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void ParameterDictionary::FreeParameters() {
    for (int i = 0; i < nOwnedParams; ++i)
        delete params[i];
    params.clear();
}